

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O0

int testValidPooling3d(void)

{
  bool bVar1;
  ModelDescription *pMVar2;
  FeatureDescription *pFVar3;
  FeatureType *pFVar4;
  ArrayFeatureType *this;
  NeuralNetwork *this_00;
  NeuralNetworkLayer *this_01;
  ostream *poVar5;
  undefined1 local_a8 [8];
  Result res;
  Pooling3DLayerParams *mutablePooling3d;
  NeuralNetworkLayer *pooling3dLayer;
  NeuralNetwork *nn;
  FeatureDescription *out3;
  ArrayFeatureType *shape;
  FeatureDescription *topIn;
  Model m1;
  
  CoreML::Specification::Model::Model((Model *)&topIn);
  pMVar2 = CoreML::Specification::Model::mutable_description((Model *)&topIn);
  pFVar3 = CoreML::Specification::ModelDescription::add_input(pMVar2);
  CoreML::Specification::FeatureDescription::set_name(pFVar3,"input");
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar3);
  this = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar4);
  CoreML::Specification::ArrayFeatureType::add_shape(this,10);
  CoreML::Specification::ArrayFeatureType::add_shape(this,0xb);
  CoreML::Specification::ArrayFeatureType::add_shape(this,0xc);
  CoreML::Specification::ArrayFeatureType::add_shape(this,0xd);
  CoreML::Specification::ArrayFeatureType::add_shape(this,0xe);
  pMVar2 = CoreML::Specification::Model::mutable_description((Model *)&topIn);
  pFVar3 = CoreML::Specification::ModelDescription::add_output(pMVar2);
  CoreML::Specification::FeatureDescription::set_name(pFVar3,"probs");
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar3);
  CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar4);
  this_00 = CoreML::Specification::Model::mutable_neuralnetwork((Model *)&topIn);
  CoreML::Specification::NeuralNetwork::set_arrayinputshapemapping(this_00,EXACT_ARRAY_MAPPING);
  this_01 = CoreML::Specification::NeuralNetwork::add_layers(this_00);
  CoreML::Specification::NeuralNetworkLayer::add_input(this_01,"input");
  CoreML::Specification::NeuralNetworkLayer::add_output(this_01,"probs");
  res.m_message.field_2._8_8_ =
       CoreML::Specification::NeuralNetworkLayer::mutable_pooling3d(this_01);
  CoreML::Specification::Pooling3DLayerParams::set_kerneldepth
            ((Pooling3DLayerParams *)res.m_message.field_2._8_8_,2);
  CoreML::Specification::Pooling3DLayerParams::set_kernelheight
            ((Pooling3DLayerParams *)res.m_message.field_2._8_8_,2);
  CoreML::Specification::Pooling3DLayerParams::set_kernelwidth
            ((Pooling3DLayerParams *)res.m_message.field_2._8_8_,2);
  CoreML::Specification::Pooling3DLayerParams::set_stridedepth
            ((Pooling3DLayerParams *)res.m_message.field_2._8_8_,5);
  CoreML::Specification::Pooling3DLayerParams::set_strideheight
            ((Pooling3DLayerParams *)res.m_message.field_2._8_8_,5);
  CoreML::Specification::Pooling3DLayerParams::set_stridewidth
            ((Pooling3DLayerParams *)res.m_message.field_2._8_8_,5);
  CoreML::Specification::Pooling3DLayerParams::set_paddingtype
            ((Pooling3DLayerParams *)res.m_message.field_2._8_8_,
             Pooling3DLayerParams_Pooling3DPaddingType_CUSTOM);
  CoreML::Specification::Pooling3DLayerParams::set_custompaddingfront
            ((Pooling3DLayerParams *)res.m_message.field_2._8_8_,7);
  CoreML::Specification::Pooling3DLayerParams::set_custompaddingback
            ((Pooling3DLayerParams *)res.m_message.field_2._8_8_,7);
  CoreML::Specification::Pooling3DLayerParams::set_custompaddingtop
            ((Pooling3DLayerParams *)res.m_message.field_2._8_8_,7);
  CoreML::Specification::Pooling3DLayerParams::set_custompaddingbottom
            ((Pooling3DLayerParams *)res.m_message.field_2._8_8_,7);
  CoreML::Specification::Pooling3DLayerParams::set_custompaddingleft
            ((Pooling3DLayerParams *)res.m_message.field_2._8_8_,7);
  CoreML::Specification::Pooling3DLayerParams::set_custompaddingright
            ((Pooling3DLayerParams *)res.m_message.field_2._8_8_,7);
  CoreML::validate<(MLModelType)500>((Result *)local_a8,(Model *)&topIn);
  bVar1 = CoreML::Result::good((Result *)local_a8);
  if (!bVar1) {
    poVar5 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x4a3);
    poVar5 = std::operator<<(poVar5,": error: ");
    poVar5 = std::operator<<(poVar5,"(res).good()");
    poVar5 = std::operator<<(poVar5," was false, expected true.");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  m1._oneof_case_[0]._1_3_ = 0;
  m1._oneof_case_[0]._0_1_ = !bVar1;
  CoreML::Result::~Result((Result *)local_a8);
  CoreML::Specification::Model::~Model((Model *)&topIn);
  return m1._oneof_case_[0];
}

Assistant:

int testValidPooling3d() {
    Specification::Model m1;

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    // Adding 5 shapes for a rank 5 input.
    shape->add_shape(10);
    shape->add_shape(11);
    shape->add_shape(12);
    shape->add_shape(13);
    shape->add_shape(14);

    auto *out3 = m1.mutable_description()->add_output();
    out3->set_name("probs");
    out3->mutable_type()->mutable_multiarraytype();

    const auto nn = m1.mutable_neuralnetwork();
    nn->set_arrayinputshapemapping(CoreML::Specification::EXACT_ARRAY_MAPPING);

    Specification::NeuralNetworkLayer *pooling3dLayer = nn->add_layers();
    pooling3dLayer->add_input("input");
    pooling3dLayer->add_output("probs");
    auto *mutablePooling3d = pooling3dLayer->mutable_pooling3d();
    
    // Add Kernel sizes
    mutablePooling3d->set_kerneldepth(2);
    mutablePooling3d->set_kernelheight(2);
    mutablePooling3d->set_kernelwidth(2);

    // Add Strides
    mutablePooling3d->set_stridedepth(5);
    mutablePooling3d->set_strideheight(5);
    mutablePooling3d->set_stridewidth(5);

    // Add 6 Custom Paddings
    mutablePooling3d->set_paddingtype(CoreML::Specification::Pooling3DLayerParams_Pooling3DPaddingType_CUSTOM);
    mutablePooling3d->set_custompaddingfront(7);
    mutablePooling3d->set_custompaddingback(7);
    mutablePooling3d->set_custompaddingtop(7);
    mutablePooling3d->set_custompaddingbottom(7);
    mutablePooling3d->set_custompaddingleft(7);
    mutablePooling3d->set_custompaddingright(7);
    
    Result res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_GOOD(res);
    
    return 0;
}